

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

cf_bool_t string_stream_read(void *stream,cf_char_t *buff,cf_size_t size)

{
  long lVar1;
  ulong local_38;
  size_t i;
  string_stream_t *s;
  cf_size_t size_local;
  cf_char_t *buff_local;
  void *stream_local;
  
  local_38 = 0;
  while (*(char *)(*stream + *(long *)((long)stream + 8)) != '\0' && local_38 < size) {
    lVar1 = *(long *)((long)stream + 8);
    *(long *)((long)stream + 8) = lVar1 + 1;
    buff[local_38] = *(cf_char_t *)(*stream + lVar1);
    local_38 = local_38 + 1;
  }
  stream_local._4_4_ = (uint)(*(char *)(*stream + *(long *)((long)stream + 8)) != '\0');
  return stream_local._4_4_;
}

Assistant:

cf_bool_t string_stream_read(void* stream, cf_char_t* buff, cf_size_t size) {
    string_stream_t* s = CF_TYPE_CAST(string_stream_t*, stream);
    size_t i = 0;
    while (s->str[s->read] != '\0' && i < size) {
        buff[i++] = s->str[s->read++];
    }
    if (s->str[s->read] == '\0') {
        return CF_FALSE;
    }

    return CF_TRUE;
}